

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeVLDST3Instruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  uint uVar3;
  DecodeStatus DVar4;
  byte bVar5;
  void *pvVar6;
  uint64_t Address_00;
  uint64_t extraout_RDX;
  uint64_t uVar7;
  uint64_t extraout_RDX_00;
  uint64_t Address_01;
  uint64_t extraout_RDX_01;
  uint64_t extraout_RDX_02;
  uint64_t extraout_RDX_03;
  uint64_t extraout_RDX_04;
  uint uVar8;
  
  bVar5 = (byte)((Insn & 0x20) >> 5) | (~Insn & 0xc0) == 0;
  if (bVar5 != 0) {
    return MCDisassembler_Fail;
  }
  if ((Insn >> 0x15 & 1) == 0) {
    DVar2 = DecodeVSTInstruction(Inst,Insn,Address,(void *)(ulong)bVar5);
    return DVar2;
  }
  uVar8 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  uVar3 = MCInst_getOpcode(Inst);
  pvVar6 = (void *)(ulong)(uVar3 - 0x391);
  if (uVar3 - 0x391 < 0xc) {
LAB_00152b82:
    DVar2 = DecodeDPairRegisterClass(Inst,uVar8,Address_00,pvVar6);
  }
  else {
    pvVar6 = (void *)(ulong)(uVar3 - 0x3d2);
    if (uVar3 - 0x3d2 < 9) {
      DVar2 = DecodeDPairSpacedRegisterClass(Inst,uVar8,Address_00,pvVar6);
    }
    else {
      if (uVar3 - 0x3db < 9) goto LAB_00152b82;
      DVar2 = DecodeDPRRegisterClass(Inst,uVar8,Address_00,pvVar6);
    }
  }
  if ((DVar2 | 2) != MCDisassembler_Success) {
    return MCDisassembler_Fail;
  }
  uVar3 = MCInst_getOpcode(Inst);
  pvVar6 = (void *)(ulong)(uVar3 - 0x43d);
  uVar7 = extraout_RDX;
  if (uVar3 - 0x43d < 0x22) {
    uVar7 = 0x999;
    if ((0x999UL >> ((ulong)pvVar6 & 0x3f) & 1) == 0) {
      if ((0x294a00000U >> ((ulong)pvVar6 & 0x3f) & 1) == 0) goto LAB_00152bdb;
LAB_00152bf6:
      uVar3 = uVar8 + 2;
    }
    else {
LAB_00152bfc:
      uVar3 = uVar8 + 1;
    }
    DVar4 = DecodeDPRRegisterClass(Inst,uVar3 & 0x1f,uVar7,pvVar6);
    if (DVar4 != MCDisassembler_Success) {
      if (DVar4 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar2 = MCDisassembler_SoftFail;
    }
  }
  else {
LAB_00152bdb:
    uVar3 = uVar3 - 0x4b1;
    if (uVar3 < 0x22) {
      pvVar6 = (void *)0x999;
      if ((0x999UL >> ((ulong)uVar3 & 0x3f) & 1) != 0) goto LAB_00152bfc;
      if ((0x294a00000U >> ((ulong)uVar3 & 0x3f) & 1) != 0) goto LAB_00152bf6;
    }
  }
  uVar3 = MCInst_getOpcode(Inst);
  pvVar6 = (void *)(ulong)(uVar3 - 0x43d);
  uVar7 = extraout_RDX_00;
  if (uVar3 - 0x43d < 0x22) {
    uVar7 = 0x999;
    if ((0x999UL >> ((ulong)pvVar6 & 0x3f) & 1) == 0) {
      if ((0x294a00000U >> ((ulong)pvVar6 & 0x3f) & 1) == 0) goto LAB_00152c40;
LAB_00152c5b:
      uVar3 = uVar8 + 4;
    }
    else {
LAB_00152c61:
      uVar3 = uVar8 + 2;
    }
    DVar4 = DecodeDPRRegisterClass(Inst,uVar3 & 0x1f,uVar7,pvVar6);
    if (DVar4 != MCDisassembler_Success) {
      if (DVar4 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar2 = MCDisassembler_SoftFail;
    }
  }
  else {
LAB_00152c40:
    uVar3 = uVar3 - 0x4b1;
    if (uVar3 < 0x22) {
      pvVar6 = (void *)0x999;
      if ((0x999UL >> ((ulong)uVar3 & 0x3f) & 1) != 0) goto LAB_00152c61;
      if ((0x294a00000U >> ((ulong)uVar3 & 0x3f) & 1) != 0) goto LAB_00152c5b;
    }
  }
  uVar3 = MCInst_getOpcode(Inst);
  uVar3 = uVar3 - 0x4b1;
  if (uVar3 < 0x22) {
    if ((0x999UL >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      if ((0x294a00000U >> ((ulong)uVar3 & 0x3f) & 1) == 0) goto LAB_00152cd0;
      uVar8 = uVar8 + 6;
    }
    else {
      uVar8 = uVar8 + 3;
    }
    DVar4 = DecodeDPRRegisterClass(Inst,uVar8 & 0x1f,Address_01,(void *)0x999);
    if (DVar4 != MCDisassembler_Success) {
      if (DVar4 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar2 = MCDisassembler_SoftFail;
    }
  }
LAB_00152cd0:
  uVar8 = Insn >> 0x10 & 0xf;
  uVar3 = MCInst_getOpcode(Inst);
  pvVar6 = (void *)(ulong)(uVar3 - 0x369);
  uVar7 = extraout_RDX_01;
  if (((uVar3 - 0x369 < 0x34) &&
      (uVar7 = 0xdb6f67860f67b, (0xdb6f67860f67bU >> ((ulong)pvVar6 & 0x3f) & 1) != 0)) ||
     ((pvVar6 = (void *)(ulong)(uVar3 - 0x3d3), uVar3 - 0x3d3 < 0x23 &&
      (uVar7 = 0x61861b6db, (0x61861b6dbU >> ((ulong)pvVar6 & 0x3f) & 1) != 0)))) {
    MCOperand_CreateImm0(Inst,0);
    uVar7 = extraout_RDX_02;
  }
  else {
    uVar1 = uVar3 - 0x440;
    pvVar6 = (void *)(ulong)uVar1;
    if ((((uVar1 < 0x1f) && (uVar7 = 0x42100111, (0x42100111U >> (uVar1 & 0x1f) & 1) != 0)) ||
        ((uVar3 - 0x4b4 < 0x1f &&
         (pvVar6 = (void *)0x42100111, (0x42100111U >> (uVar3 - 0x4b4 & 0x1f) & 1) != 0)))) &&
       (DVar4 = DecodeGPRRegisterClass(Inst,uVar8,uVar7,pvVar6), uVar7 = extraout_RDX_04,
       DVar4 != MCDisassembler_Success)) {
      if (DVar4 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar2 = MCDisassembler_SoftFail;
    }
  }
  DVar4 = DecodeAddrMode6Operand(Inst,uVar8 | Insn & 0x30,uVar7,pvVar6);
  if (DVar4 != MCDisassembler_Success) {
    if (DVar4 != MCDisassembler_SoftFail) {
      return MCDisassembler_Fail;
    }
    DVar2 = MCDisassembler_SoftFail;
  }
  uVar3 = MCInst_getOpcode(Inst);
  pvVar6 = (void *)(ulong)(uVar3 - 0x369);
  uVar7 = extraout_RDX_03;
  if ((0x33 < uVar3 - 0x369) ||
     (uVar7 = 0xdb6d26820d269, (0xdb6d26820d269U >> ((ulong)pvVar6 & 0x3f) & 1) == 0)) {
    if ((uVar3 - 0x3d3 < 0x22) &&
       (pvVar6 = (void *)0x208209249, (0x208209249U >> ((ulong)(uVar3 - 0x3d3) & 0x3f) & 1) != 0)) {
      return DVar2;
    }
    if ((Insn & 0xf) == 0xd) {
      MCOperand_CreateReg0(Inst,0);
      return DVar2;
    }
  }
  if ((((~Insn & 0xd) != 0) &&
      (DVar4 = DecodeGPRRegisterClass(Inst,Insn & 0xf,uVar7,pvVar6), DVar4 != MCDisassembler_Success
      )) && (DVar2 = MCDisassembler_Fail, DVar4 == MCDisassembler_SoftFail)) {
    DVar2 = MCDisassembler_SoftFail;
  }
  return DVar2;
}

Assistant:

static DecodeStatus DecodeVLDST3Instruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	unsigned align, load;
	unsigned size = fieldFromInstruction_4(Insn, 6, 2);
	if (size == 3) return MCDisassembler_Fail;

	align = fieldFromInstruction_4(Insn, 4, 2);
	if (align & 2) return MCDisassembler_Fail;

	load = fieldFromInstruction_4(Insn, 21, 1);
	return load ? DecodeVLDInstruction(Inst, Insn, Address, Decoder)
		: DecodeVSTInstruction(Inst, Insn, Address, Decoder);
}